

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.cpp
# Opt level: O0

size_t DecideMultiByteStatsLevel(size_t pos,size_t len,size_t mask,uint8_t *data)

{
  ulong c_00;
  size_t sVar1;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t c;
  size_t i;
  size_t last_c;
  size_t max_utf8;
  size_t counts [3];
  ulong local_50;
  size_t local_48;
  ulong local_40;
  long local_38 [4];
  ulong local_18;
  ulong local_10;
  long local_8;
  
  local_38[3] = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_38,0,0x18);
  local_48 = 0;
  for (local_50 = 0; local_50 < local_10; local_50 = local_50 + 1) {
    c_00 = (ulong)*(byte *)(local_38[3] + (local_8 + local_50 & local_18));
    sVar1 = UTF8Position(local_48,c_00,2);
    local_38[sVar1] = local_38[sVar1] + 1;
    local_48 = c_00;
  }
  local_40 = (ulong)(0x18 < (ulong)(local_38[1] + local_38[2]));
  return local_40;
}

Assistant:

static size_t DecideMultiByteStatsLevel(size_t pos, size_t len, size_t mask,
                                        const uint8_t* data) {
  size_t counts[3] = { 0 };
  size_t max_utf8 = 1;  /* should be 2, but 1 compresses better. */
  size_t last_c = 0;
  size_t i;
  for (i = 0; i < len; ++i) {
    size_t c = data[(pos + i) & mask];
    ++counts[UTF8Position(last_c, c, 2)];
    last_c = c;
  }
  if (counts[2] < 500) {
    max_utf8 = 1;
  }
  if (counts[1] + counts[2] < 25) {
    max_utf8 = 0;
  }
  return max_utf8;
}